

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  uint64_t uVar1;
  double dVar2;
  bool bVar3;
  difference_type __d;
  ulong uVar4;
  pointer ppVar5;
  pointer ppVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 in_ZMM1 [64];
  double recall;
  double precision;
  int local_7c;
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *local_78;
  double local_70;
  double local_68;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_60;
  pair<double,_double> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c = labelId;
  getPositiveCounts(&local_60,this,labelId);
  if (local_60.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_78 = (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__;
    if (local_7c != -1) {
      this = (Meter *)std::__detail::
                      _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->labelMetrics_,&local_7c);
    }
    auVar8 = in_ZMM1._0_16_;
    uVar1 = (this->metrics_).gold;
    uVar7 = (long)local_60.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_60.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    ppVar5 = local_60.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (long)uVar7) {
      auVar8 = vcvtusi2sd_avx512f(auVar8,uVar1);
      local_68 = auVar8._0_8_;
      do {
        uVar4 = uVar7 >> 1;
        local_48 = (pair<double,_double>)vcvtuqq2pd_avx512vl((undefined1  [16])ppVar5[uVar4]);
        local_70 = local_68;
        bVar3 = utils::compareFirstLess(&local_48,&local_70);
        auVar8 = in_ZMM1._0_16_;
        uVar7 = uVar7 + ~uVar4;
        ppVar6 = ppVar5 + uVar4 + 1;
        if (!bVar3) {
          uVar7 = uVar4;
          ppVar6 = ppVar5;
        }
        ppVar5 = ppVar6;
      } while (0 < (long)uVar7);
    }
    __return_storage_ptr__ =
         (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)local_78;
    if (local_60.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppVar5 + (ppVar5 !=
                 local_60.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      auVar8 = vcvtusi2sd_avx512f(auVar8,uVar1);
      local_68 = auVar8._0_8_;
      ppVar6 = local_60.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar2 = local_48.second;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_48.second;
        local_48 = (pair<double,_double>)(auVar8 << 0x40);
        auVar8 = vcvtuqq2pd_avx512vl((undefined1  [16])*ppVar6);
        dVar9 = auVar8._0_8_;
        dVar10 = dVar9 + auVar8._8_8_;
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          local_48.first = dVar9 / dVar10;
          local_48 = (pair<double,_double>)CONCAT88(dVar2,local_48.first);
        }
        local_70 = (double)((ulong)(uVar1 == 0) * 0x7ff8000000000000 +
                           (ulong)(uVar1 != 0) * (long)(dVar9 / local_68));
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double&,double&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_48.first,&local_70);
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar5 + (ppVar5 !=
                                  local_60.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish));
    }
    local_48.first = 1.0;
    local_70 = 0.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_48.first,&local_70);
  }
  if (local_60.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
         (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
         __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}